

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_client_core_ll.c
# Opt level: O0

IOTHUB_CLIENT_RESULT
IoTHubClientCore_LL_NotifyUploadCompletion
          (IOTHUB_CLIENT_CORE_LL_HANDLE iotHubClientHandle,char *uploadCorrelationId,_Bool isSuccess
          ,int responseCode,char *responseMessage)

{
  LOGGER_LOG p_Var1;
  LOGGER_LOG l;
  IOTHUB_CLIENT_RESULT result;
  char *responseMessage_local;
  int responseCode_local;
  _Bool isSuccess_local;
  char *uploadCorrelationId_local;
  IOTHUB_CLIENT_CORE_LL_HANDLE iotHubClientHandle_local;
  
  if (iotHubClientHandle == (IOTHUB_CLIENT_CORE_LL_HANDLE)0x0) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                ,"IoTHubClientCore_LL_NotifyUploadCompletion",0xbf6,1,
                "invalid parameter iotHubClientHandle=%p",0);
    }
    l._4_4_ = IOTHUB_CLIENT_INVALID_ARG;
  }
  else {
    l._4_4_ = IoTHubClient_LL_UploadToBlob_NotifyCompletion
                        (iotHubClientHandle->uploadToBlobHandle,uploadCorrelationId,isSuccess,
                         responseCode,responseMessage);
  }
  return l._4_4_;
}

Assistant:

IOTHUB_CLIENT_RESULT IoTHubClientCore_LL_NotifyUploadCompletion(IOTHUB_CLIENT_CORE_LL_HANDLE iotHubClientHandle, const char* uploadCorrelationId, bool isSuccess, int responseCode, const char* responseMessage)
{
    IOTHUB_CLIENT_RESULT result;

    if (iotHubClientHandle == NULL)
    {
        LogError("invalid parameter iotHubClientHandle=%p", iotHubClientHandle);
        result = IOTHUB_CLIENT_INVALID_ARG;
    }
    else
    {
        result = IoTHubClient_LL_UploadToBlob_NotifyCompletion(iotHubClientHandle->uploadToBlobHandle, uploadCorrelationId, isSuccess, responseCode, responseMessage);
    }

    return result;
}